

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall testing::internal::String::ShowWideCStringQuoted(String *this,wchar_t *wide_c_str)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  String SVar2;
  String local_20;
  
  if (wide_c_str == (wchar_t *)0x0) {
    String(this,"(null)");
    sVar1 = extraout_RDX_00;
  }
  else {
    ShowWideCString(&local_20,wide_c_str);
    Format((char *)this,"L\"%s\"",local_20.c_str_);
    ~String(&local_20);
    sVar1 = extraout_RDX;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

String String::ShowWideCStringQuoted(const wchar_t* wide_c_str) {
  if (wide_c_str == NULL) return String("(null)");

  return String::Format("L\"%s\"",
                        String::ShowWideCString(wide_c_str).c_str());
}